

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O3

void __thiscall
wallet::group_outputs_tests::GroupVerifier::GroupVerify
          (GroupVerifier *this,OutputType type,CoinEligibilityFilter *filter,
          bool avoid_partial_spends,bool positive_only,int expected_size)

{
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *this_00;
  long lVar1;
  CWallet *wallet;
  undefined8 uVar2;
  void *pvVar3;
  mapped_type *__x;
  mapped_type *pmVar4;
  assertion_result *filters;
  undefined4 in_register_0000008c;
  iterator pvVar5;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  const_string file;
  const_string msg;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  int expected_size_local;
  OutputType type_local;
  int *local_188;
  _Base_ptr local_180;
  char *local_178;
  _Base_ptr local_170;
  assertion_result local_168;
  CoinSelectionParams local_150;
  undefined1 local_f8 [8];
  bool bStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined7 uStack_e7;
  bool bStack_e0;
  undefined7 uStack_df;
  bool local_d8;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  _Base_ptr local_b0;
  OutputGroupTypeMap groups;
  
  pvVar5 = (iterator)CONCAT44(in_register_0000008c,expected_size);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet = (this->wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_150.rng_fast = &this->rand;
  local_150.change_output_size = 0;
  local_150.change_spend_size = 0;
  local_150.m_min_change_target = 1000000;
  local_150.min_viable_change = 0;
  local_150.m_change_fee = 0;
  local_150.m_cost_of_change = 0;
  local_150.m_effective_feerate.nSatoshisPerK = 0;
  local_150.m_long_term_feerate.nSatoshisPerK = 0;
  local_150.m_discard_feerate.nSatoshisPerK._0_5_ = 0;
  local_150.m_discard_feerate.nSatoshisPerK._5_3_ = 0;
  local_150.tx_noinputs_size = 0;
  local_150.m_subtract_fee_outputs = false;
  local_150.m_include_unsafe_inputs = false;
  local_150.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  local_f8 = *(undefined1 (*) [8])filter;
  uVar2 = *(undefined8 *)((long)&filter->max_descendants + 1);
  uStack_e8 = (undefined1)((ulong)*(undefined8 *)((long)&filter->max_ancestors + 1) >> 0x38);
  uStack_e7 = (undefined7)uVar2;
  bStack_e0 = SUB81((ulong)uVar2 >> 0x38,0);
  bStack_f0 = SUB81(filter->max_ancestors,0);
  uStack_ef = (undefined7)(filter->max_ancestors >> 8);
  local_d8 = true;
  __l._M_len = 1;
  __l._M_array = (iterator)local_f8;
  expected_size_local = expected_size;
  type_local = type;
  local_150.m_avoid_partial_spends = avoid_partial_spends;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)&local_168
             ,__l,(allocator_type *)&local_178);
  filters = &local_168;
  GroupOutputs((FilteredOutputGroups *)&local_c8,wallet,&this->coins_pool,&local_150,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)filters)
  ;
  __x = std::
        map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
        ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                      *)&local_c8,filter);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  ::_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
              *)&groups,
             (_Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
              *)__x);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
            (&groups.all_groups.positive_group,&(__x->all_groups).positive_group);
  this_00 = &groups.all_groups.mixed_group;
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
            (this_00,&(__x->all_groups).mixed_group);
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree((_Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
               *)&local_c8);
  pvVar3 = (void *)CONCAT71(local_168._1_7_,
                            local_168.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_168.m_message.pn.pi_ - (long)pvVar3);
  }
  if (positive_only) {
    pmVar4 = std::
             map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
             ::operator[](&groups.groups_by_type,&type_local);
  }
  else {
    pmVar4 = std::
             map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
             ::operator[](&groups.groups_by_type,&type_local);
    pmVar4 = (mapped_type *)&pmVar4->mixed_group;
  }
  local_1b8._M_right = (_Base_ptr)0xf601cd;
  local_198 = "";
  local_1b8._M_parent = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_1b8._M_left = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5d;
  file.m_begin = (iterator)&local_1b8._M_right;
  msg.m_end = pvVar5;
  msg.m_begin = (iterator)filters;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&local_1b8._M_parent,msg);
  local_180 = &local_1b8;
  bStack_f0 = false;
  local_f8 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  uStack_e8 = 0x38;
  uStack_e7 = 0x139d1;
  bStack_e0 = true;
  uStack_df = 0xf4ae;
  local_1b8._0_8_ =
       ((long)(pmVar4->positive_group).
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pmVar4->positive_group).
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b8._0_8_ - (long)expected_size == 0);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
  ;
  local_170 = (_Base_ptr)0xf60240;
  local_150.min_viable_change = (CAmount)&local_180;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.rng_fast = (FastRandomContext *)&PTR__lazy_ostream_01388f48;
  local_150.m_min_change_target = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_188 = &expected_size_local;
  local_b0 = (_Base_ptr)&local_188;
  local_c0 = _S_red;
  local_c8 = &PTR__lazy_ostream_013890c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)local_f8,1,2,REQUIRE,0xf60356,(size_t)&local_178,0x5d,
             &local_150,"expected_size",
             (_Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
              *)&local_c8);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(this_00);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
            (&groups.all_groups.positive_group);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
               *)&groups);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GroupVerify(const OutputType type,
                     const CoinEligibilityFilter& filter,
                     bool avoid_partial_spends,
                     bool positive_only,
                     int expected_size)
    {
        OutputGroupTypeMap groups = GroupOutputs(*wallet, coins_pool, makeSelectionParams(rand, avoid_partial_spends), {{filter}})[filter];
        std::vector<OutputGroup>& groups_out = positive_only ? groups.groups_by_type[type].positive_group :
                                               groups.groups_by_type[type].mixed_group;
        BOOST_CHECK_EQUAL(groups_out.size(), expected_size);
    }